

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

void secp256k1_pubkey_save(secp256k1_pubkey *pubkey,secp256k1_ge *ge)

{
  int iVar1;
  secp256k1_ge_storage s;
  secp256k1_ge_storage local_58;
  
  iVar1 = secp256k1_ge_is_infinity(ge);
  if (iVar1 == 0) {
    secp256k1_ge_to_storage(&local_58,ge);
    *(uint64_t *)(pubkey->data + 0x30) = local_58.y.n[2];
    *(uint64_t *)(pubkey->data + 0x38) = local_58.y.n[3];
    *(uint64_t *)(pubkey->data + 0x20) = local_58.y.n[0];
    *(uint64_t *)(pubkey->data + 0x28) = local_58.y.n[1];
    *(uint64_t *)(pubkey->data + 0x10) = local_58.x.n[2];
    *(uint64_t *)(pubkey->data + 0x18) = local_58.x.n[3];
    *(uint64_t *)pubkey->data = local_58.x.n[0];
    *(uint64_t *)(pubkey->data + 8) = local_58.x.n[1];
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/group_impl.h"
          ,0x3b0,"test condition failed: !secp256k1_ge_is_infinity(a)");
  abort();
}

Assistant:

static void secp256k1_pubkey_save(secp256k1_pubkey* pubkey, secp256k1_ge* ge) {
    secp256k1_ge_to_bytes(pubkey->data, ge);
}